

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O2

TimingControl * __thiscall
slang::ast::ContinuousAssignSymbol::getDelay(ContinuousAssignSymbol *this)

{
  optional<const_slang::ast::TimingControl_*> *this_00;
  Scope *scope;
  SyntaxNode *pSVar1;
  TimingControlSyntax *pTVar2;
  ContinuousAssignSyntax *pCVar3;
  _Storage<const_slang::ast::TimingControl_*,_true> _Var4;
  TimingControl **ppTVar5;
  Delay3Control *pDVar6;
  Expression *pEVar7;
  AssignmentExpression *pAVar8;
  TimingControl *pTVar9;
  LookupLocation LVar10;
  LookupLocation lookupLocation;
  ExpressionVarVisitor visitor;
  ASTContext context;
  ExpressionVarVisitor local_61;
  ASTContext local_60;
  undefined4 extraout_var;
  socklen_t __len;
  
  this_00 = &this->delay;
  if ((this->delay).super__Optional_base<const_slang::ast::TimingControl_*,_true,_true>._M_payload.
      super__Optional_payload_base<const_slang::ast::TimingControl_*>._M_engaged == true) {
LAB_001a87d1:
    pTVar9 = (this_00->super__Optional_base<const_slang::ast::TimingControl_*,_true,_true>).
             _M_payload.super__Optional_payload_base<const_slang::ast::TimingControl_*>._M_payload.
             _M_value;
  }
  else {
    scope = (this->super_Symbol).parentScope;
    pSVar1 = (this->super_Symbol).originatingSyntax;
    if ((pSVar1 == (SyntaxNode *)0x0 || scope == (Scope *)0x0) ||
       (pSVar1 = pSVar1->parent, pSVar1 == (SyntaxNode *)0x0)) {
      (this->delay).super__Optional_base<const_slang::ast::TimingControl_*,_true,_true>._M_payload.
      super__Optional_payload_base<const_slang::ast::TimingControl_*>._M_engaged = true;
      (this->delay).super__Optional_base<const_slang::ast::TimingControl_*,_true,_true>._M_payload.
      super__Optional_payload_base<const_slang::ast::TimingControl_*>._M_payload._M_value =
           (TimingControl *)0x0;
    }
    else {
      pCVar3 = slang::syntax::SyntaxNode::as<slang::syntax::ContinuousAssignSyntax>(pSVar1);
      pTVar2 = pCVar3->delay;
      if (pTVar2 != (TimingControlSyntax *)0x0) {
        LVar10 = LookupLocation::before(&this->super_Symbol);
        lookupLocation._8_8_ = LVar10._8_8_ & 0xffffffff;
        lookupLocation.scope = LVar10.scope;
        ASTContext::ASTContext(&local_60,scope,lookupLocation,(bitmask<slang::ast::ASTFlags>)0x80);
        _Var4._0_4_ = TimingControl::bind((int)pTVar2,(sockaddr *)&local_60,__len);
        _Var4._4_4_ = extraout_var;
        if ((this->delay).super__Optional_base<const_slang::ast::TimingControl_*,_true,_true>.
            _M_payload.super__Optional_payload_base<const_slang::ast::TimingControl_*>._M_engaged ==
            false) {
          (this->delay).super__Optional_base<const_slang::ast::TimingControl_*,_true,_true>.
          _M_payload.super__Optional_payload_base<const_slang::ast::TimingControl_*>._M_engaged =
               true;
        }
        (this_00->super__Optional_base<const_slang::ast::TimingControl_*,_true,_true>)._M_payload.
        super__Optional_payload_base<const_slang::ast::TimingControl_*>._M_payload = _Var4;
        ppTVar5 = std::optional<const_slang::ast::TimingControl_*>::value(this_00);
        if ((*ppTVar5)->kind == Delay3) {
          pDVar6 = TimingControl::as<slang::ast::Delay3Control>(*ppTVar5);
          if (pDVar6->expr2 != (Expression *)0x0) {
            pEVar7 = getAssignment(this);
            if (pEVar7->kind == Assignment) {
              pAVar8 = Expression::as<slang::ast::AssignmentExpression>(pEVar7);
              pEVar7 = pAVar8->left_;
              local_61.anyVars = false;
              Expression::visit<slang::ast::ExpressionVarVisitor&>(pEVar7,&local_61);
              if (local_61.anyVars == true) {
                ASTContext::addDiag(&local_60,(DiagCode)0x190006,pEVar7->sourceRange);
              }
            }
          }
        }
        goto LAB_001a87d1;
      }
      if ((this->delay).super__Optional_base<const_slang::ast::TimingControl_*,_true,_true>.
          _M_payload.super__Optional_payload_base<const_slang::ast::TimingControl_*>._M_engaged ==
          false) {
        (this->delay).super__Optional_base<const_slang::ast::TimingControl_*,_true,_true>._M_payload
        .super__Optional_payload_base<const_slang::ast::TimingControl_*>._M_engaged = true;
      }
      (this_00->super__Optional_base<const_slang::ast::TimingControl_*,_true,_true>)._M_payload.
      super__Optional_payload_base<const_slang::ast::TimingControl_*>._M_payload._M_value =
           (TimingControl *)0x0;
    }
    pTVar9 = (TimingControl *)0x0;
  }
  return pTVar9;
}

Assistant:

const TimingControl* ContinuousAssignSymbol::getDelay() const {
    if (delay)
        return *delay;

    auto scope = getParentScope();
    auto syntax = getSyntax();
    if (!scope || !syntax || !syntax->parent) {
        delay = nullptr;
        return nullptr;
    }

    auto delaySyntax = syntax->parent->as<ContinuousAssignSyntax>().delay;
    if (!delaySyntax) {
        delay = nullptr;
        return nullptr;
    }

    ASTContext context(*scope, LookupLocation::before(*this), ASTFlags::NonProcedural);
    delay = &TimingControl::bind(*delaySyntax, context);

    // A multi-delay is disallowed if the lhs references variables.
    auto& d = *delay.value();
    if (d.kind == TimingControlKind::Delay3) {
        auto& d3 = d.as<Delay3Control>();
        if (d3.expr2) {
            auto& expr = getAssignment();
            if (expr.kind == ExpressionKind::Assignment) {
                auto& left = expr.as<AssignmentExpression>().left();
                ExpressionVarVisitor visitor;
                left.visit(visitor);
                if (visitor.anyVars)
                    context.addDiag(diag::Delay3OnVar, left.sourceRange);
            }
        }
    }

    return *delay;
}